

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IStream * Catch::makeStream(StringRef *filename)

{
  char cVar1;
  bool bVar2;
  IStream *pIVar3;
  streambuf *this;
  char *pcVar4;
  IStream *this_00;
  long in_FS_OFFSET;
  ReusableStringStream RStack_68;
  StringRef local_50;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (filename->m_size == 0) {
    pIVar3 = (IStream *)operator_new(0x118);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__CoutStream_001e1878;
    std::ostream::ostream
              (pIVar3 + 1,*(streambuf **)(__cxa_end_catch + *(long *)(std::cout + -0x18)));
  }
  else {
    cVar1 = StringRef::operator[](filename,0);
    if (cVar1 == '%') {
      local_40._M_dataplus._M_p = "%debug";
      local_40._M_string_length = 6;
      bVar2 = StringRef::operator==(filename,(StringRef *)&local_40);
      if (!bVar2) {
        ReusableStringStream::ReusableStringStream(&RStack_68);
        std::operator<<(RStack_68.m_oss,"Unrecognised stream: \'");
        operator<<(RStack_68.m_oss,filename);
        std::operator<<(RStack_68.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          throw_domain_error(&local_40);
        }
        goto LAB_00177a68;
      }
      pIVar3 = (IStream *)operator_new(0x120);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_001e18b8;
      this = (streambuf *)operator_new(0x148);
      std::streambuf::streambuf(this);
      *(undefined ***)this = &PTR__StreamBufImpl_001e18f8;
      *(streambuf **)(this + 0x28) = this + 0x40;
      *(streambuf **)(this + 0x20) = this + 0x40;
      *(streambuf **)(this + 0x30) = this + 0x140;
      pIVar3[1]._vptr_IStream = (_func_int **)this;
      std::ostream::ostream(pIVar3 + 2,this);
    }
    else {
      pIVar3 = (IStream *)operator_new(0x208);
      local_50.m_start = filename->m_start;
      local_50.m_size = filename->m_size;
      pIVar3->_vptr_IStream = (_func_int **)&PTR__FileStream_001e1990;
      this_00 = pIVar3 + 1;
      std::ofstream::ofstream(this_00);
      pcVar4 = StringRef::c_str(&local_50);
      std::ofstream::open((char *)this_00,(_Ios_Openmode)pcVar4);
      if (((byte)this_00->_vptr_IStream[-3][(long)&pIVar3[5]._vptr_IStream] & 5) != 0) {
        ReusableStringStream::ReusableStringStream(&RStack_68);
        std::operator<<(RStack_68.m_oss,"Unable to open file: \'");
        operator<<(RStack_68.m_oss,&local_50);
        std::operator<<(RStack_68.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          throw_domain_error(&local_40);
        }
        goto LAB_00177a68;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pIVar3;
  }
LAB_00177a68:
  __stack_chk_fail();
}

Assistant:

auto makeStream( StringRef const &filename ) -> IStream const* {
        if( filename.empty() )
            return new Detail::CoutStream();
        else if( filename[0] == '%' ) {
            if( filename == "%debug" )
                return new Detail::DebugOutStream();
            else
                CATCH_ERROR( "Unrecognised stream: '" << filename << "'" );
        }
        else
            return new Detail::FileStream( filename );
    }